

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

int lclearbuffer(lua_State *L)

{
  socket_buffer *sb_00;
  socket_buffer *sb;
  lua_State *L_local;
  
  sb_00 = (socket_buffer *)lua_touserdata(L,1);
  if (sb_00 == (socket_buffer *)0x0) {
    L_local._4_4_ = luaL_error(L,"Need buffer object at param 1");
  }
  else {
    luaL_checktype(L,2,5);
    while (sb_00->head != (buffer_node *)0x0) {
      return_free_node(L,2,sb_00);
    }
    sb_00->size = 0;
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int
lclearbuffer(lua_State *L) {
	struct socket_buffer * sb = lua_touserdata(L, 1);
	if (sb == NULL) {
		return luaL_error(L, "Need buffer object at param 1");
	}
	luaL_checktype(L,2,LUA_TTABLE);
	while(sb->head) {
		return_free_node(L,2,sb);
	}
	sb->size = 0;
	return 0;
}